

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::
get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
          (GeomPrimvar *this,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *dest,
          string *err)

{
  Attribute *this_00;
  bool bVar1;
  uint32_t tyid;
  value_type *__x;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_01;
  const_reference pvVar2;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *__x_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_b5;
  undefined1 local_b4 [4];
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a0;
  string local_90;
  undefined1 local_88 [24];
  string local_70;
  string local_50;
  
  if (dest != (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)0x0) {
    this_00 = &this->_attr;
    bVar1 = Attribute::is_blocked(this_00);
    if (!bVar1) {
      bVar1 = primvar::PrimVar::has_value(&(this->_attr)._var);
      if (!bVar1) {
        if (*(pointer *)
             ((long)&(this->_attr)._var._ts._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data + 8) ==
            (this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          return (bool)(string)0x0;
        }
        this_01 = tinyusdz::value::TimeSamples::get_samples(&(this->_attr)._var._ts);
        pvVar2 = ::std::
                 vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ::at((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)this_01,0);
        __x_00 = tinyusdz::value::Value::
                 as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                           (&pvVar2->value,false);
        if (__x_00 != (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      0x0) {
          ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
          operator=(dest,__x_00);
          return (bool)(string)0x1;
        }
        return (bool)(string)0x0;
      }
      tyid = Attribute::type_id(this_00);
      bVar1 = IsSupportedGeomPrimvarType(tyid);
      if (bVar1) {
        Attribute::
        get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                  ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                    *)local_b0,this_00);
        local_90 = local_b0[0];
        if (local_b0[0] == (string)0x1) {
          local_88._0_8_ = local_b0._8_8_;
          local_88._8_8_ = aStack_a0._0_8_;
          local_88._16_8_ = aStack_a0._8_8_;
          local_b0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          aStack_a0._0_8_ = 0;
          aStack_a0._8_8_ = 0;
          nonstd::optional_lite::
          optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
          ::~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                       *)local_b0);
          __x = nonstd::optional_lite::
                optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                ::value((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                         *)&local_90);
          ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
          operator=(dest,__x);
        }
        else {
          nonstd::optional_lite::
          optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
          ::~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                       *)local_b0);
          if (err != (string *)0x0) {
            ::std::__cxx11::string::string
                      ((string *)&local_50,
                       "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                       ,&local_b5);
            local_b4 = (undefined1  [4])0x10002e;
            Attribute::type_name_abi_cxx11_(&local_70,this_00);
            fmt::format<unsigned_int,std::__cxx11::string>
                      ((string *)local_b0,(fmt *)&local_50,(string *)local_b4,(uint *)&local_70,
                       in_R8);
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
        }
        nonstd::optional_lite::
        optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
        ~optional((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                   *)&local_90);
        return (bool)local_b0[0];
      }
      if (err == (string *)0x0) {
        return (bool)(string)0x0;
      }
      ::std::__cxx11::string::string
                ((string *)local_b0,"Unsupported type for GeomPrimvar. type = `{}`",
                 (allocator *)&local_70);
      Attribute::type_name_abi_cxx11_(&local_50,this_00);
      fmt::format<std::__cxx11::string>
                ((string *)&local_90,(fmt *)local_b0,(string *)&local_50,in_RCX);
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      return (bool)(string)0x0;
    }
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}